

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

void __thiscall chrono::ChFrame<double>::ArchiveIN(ChFrame<double> *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChCoordsys<double>_> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChFrame<double>>(marchive);
  local_28._value = &this->coord;
  local_28._name = "coord";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  ChMatrix33<double>::Set_A_quaternion(&this->Amatrix,&(this->coord).rot);
  return;
}

Assistant:

virtual void ArchiveIN(ChArchiveIn& marchive) {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<ChFrame<double>>();
        // stream in all member data
        marchive >> CHNVP(coord);
        Amatrix.Set_A_quaternion(coord.rot);
    }